

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetSmallNumEFails(void *arkode_mem,int small_nef)

{
  int iVar1;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetSmallNumEFails",&local_10,&local_18);
  if (iVar1 == 0) {
    iVar1 = 2;
    if (0 < small_nef) {
      iVar1 = small_nef;
    }
    local_18->small_nef = iVar1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetSmallNumEFails(void *arkode_mem, int small_nef)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetSmallNumEFails",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* if argument legal set it, otherwise set default */
  if (small_nef <= 0) {
    hadapt_mem->small_nef = SMALL_NEF;
  } else {
    hadapt_mem->small_nef = small_nef;
  }

  return(ARK_SUCCESS);
}